

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  int iVar1;
  long in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar2;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uchar *in_stack_ffffffffffffffc8;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  uint local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar2 = 0;
    if (in_stack_ffffffffffffffc0 == 0) {
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xffffffffffffffc8);
      bVar2 = iVar1 != 0 ^ 0xff;
    }
    local_4 = (uint)(bVar2 & 1);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffc8);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = !overflow && !secp256k1_scalar_is_zero(&sec);
    secp256k1_scalar_clear(&sec);
    return ret;
}